

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

OPJ_BOOL opj_end_decompress(opj_codec_t *p_codec,opj_stream_t *p_stream)

{
  OPJ_BOOL OVar1;
  
  if ((p_stream != (opj_stream_t *)0x0 && p_codec != (opj_codec_t *)0x0) &&
     (*(int *)(p_codec + 0x11) != 0)) {
    OVar1 = (*(code *)p_codec[4])(p_codec[10],p_stream,p_codec + 0xb);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_end_decompress (	opj_codec_t *p_codec,
											opj_stream_t *p_stream)
{
	if (p_codec && p_stream) {
		opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;
		opj_stream_private_t * l_stream = (opj_stream_private_t *) p_stream;

		if (! l_codec->is_decompressor) {
			return OPJ_FALSE;
		}
		
		return l_codec->m_codec_data.m_decompression.opj_end_decompress(l_codec->m_codec,
																		l_stream,
																		&(l_codec->m_event_mgr) );
	}

	return OPJ_FALSE;
}